

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void highbd_inv_txfm_add_4x4_c(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  int32_t *dest_00;
  undefined1 *in_RCX;
  tran_low_t *in_RDI;
  TX_TYPE tx_type;
  int32_t *src;
  int lossless;
  int bd;
  int eob;
  TX_TYPE in_stack_0000004b;
  int in_stack_0000004c;
  uint16_t *in_stack_00000050;
  int32_t *in_stack_00000058;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  
  iVar1 = *(int *)(in_RCX + 4);
  dest_00 = cast_to_int32(in_RDI);
  if (iVar1 == 0) {
    av1_inv_txfm2d_add_4x4_c
              (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_0000004b,input._4_4_);
  }
  else {
    av1_highbd_iwht4x4_add
              ((tran_low_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),(uint8_t *)dest_00,
               CONCAT13(*in_RCX,(int3)in_stack_ffffffffffffffc4),in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static void highbd_inv_txfm_add_4x4_c(const tran_low_t *input, uint8_t *dest,
                                      int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  int eob = txfm_param->eob;
  int bd = txfm_param->bd;
  int lossless = txfm_param->lossless;
  const int32_t *src = cast_to_int32(input);
  const TX_TYPE tx_type = txfm_param->tx_type;
  if (lossless) {
    assert(tx_type == DCT_DCT);
    av1_highbd_iwht4x4_add(input, dest, stride, eob, bd);
    return;
  }

  av1_inv_txfm2d_add_4x4_c(src, CONVERT_TO_SHORTPTR(dest), stride, tx_type, bd);
}